

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManGraphUpdate(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex,Nwk_Vrt_t *pNext)

{
  int iVar1;
  int iVar2;
  Nwk_Vrt_t *pNVar3;
  Nwk_Vrt_t *pNVar4;
  Nwk_Vrt_t **ppNVar5;
  Nwk_Vrt_t *pNVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  Nwk_ManGraphListExtract(p,pVertex);
  Nwk_ManGraphListExtract(p,pNext);
  if (0 < pVertex->nEdges) {
    lVar13 = 0;
    do {
      pNVar3 = p->pVerts[(&pVertex[1].Id)[lVar13]];
      if (pNVar3 != pNext) {
        Nwk_ManGraphListExtract(p,pNVar3);
        uVar7 = pNVar3->nEdges;
        if (1 < (int)uVar7) {
          lVar12 = 0;
          do {
            pNVar4 = p->pVerts[(&pNVar3[1].Id)[lVar12]];
            if ((pNVar4 != pVertex) && (pNVar4->nEdges < 2)) {
              if (pNVar4->nEdges != 1) {
                __assert_fail("pOther->nEdges == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                              ,0x1df,
                              "void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)");
              }
              Nwk_ManGraphListExtract(p,pNVar4);
              pNVar3->nEdges = pNVar3->nEdges + -1;
              uVar7 = pNVar4->nEdges;
              lVar8 = (long)(int)uVar7;
              if (lVar8 < 1) goto LAB_004e9a03;
              if (uVar7 == 1) {
                ppNVar5 = p->pVerts;
                lVar8 = (long)ppNVar5[pNVar4[1].Id]->nEdges;
                if (lVar8 < 0x10) {
                  iVar1 = pNVar4->Id;
                  if ((long)p->pLists1[lVar8] != 0) {
                    pNVar6 = ppNVar5[p->pLists1[lVar8]];
                    pNVar4->iPrev = 0;
                    pNVar4->iNext = pNVar6->Id;
                    pNVar6->iPrev = iVar1;
                  }
                  p->pLists1[lVar8] = iVar1;
                }
                else {
                  iVar1 = pNVar4->Id;
                  if ((long)p->pLists1[0x10] != 0) {
                    pNVar6 = ppNVar5[p->pLists1[0x10]];
                    pNVar4->iPrev = 0;
                    pNVar4->iNext = pNVar6->Id;
                    pNVar6->iPrev = iVar1;
                  }
                  p->pLists1[0x10] = iVar1;
                }
              }
              else if (uVar7 < 0x10) {
                iVar1 = pNVar4->Id;
                if ((long)p->pLists2[lVar8] != 0) {
                  pNVar6 = p->pVerts[p->pLists2[lVar8]];
                  pNVar4->iPrev = 0;
                  pNVar4->iNext = pNVar6->Id;
                  pNVar6->iPrev = iVar1;
                }
                p->pLists2[lVar8] = iVar1;
              }
              else {
                iVar1 = pNVar4->Id;
                if ((long)p->pLists2[0x10] != 0) {
                  pNVar6 = p->pVerts[p->pLists2[0x10]];
                  pNVar4->iPrev = 0;
                  pNVar4->iNext = pNVar6->Id;
                  pNVar6->iPrev = iVar1;
                }
                p->pLists2[0x10] = iVar1;
              }
              uVar7 = pNVar3->nEdges + 1;
              pNVar3->nEdges = uVar7;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)uVar7);
        }
        if ((int)uVar7 < 1) goto LAB_004e99e4;
        uVar11 = 0;
        while ((&pNVar3[1].Id)[uVar11] != pVertex->Id) {
          uVar11 = uVar11 + 1;
          if (uVar7 == uVar11) goto LAB_004e99e4;
        }
        uVar9 = uVar7 - 1;
        pNVar3->nEdges = uVar9;
        if ((int)uVar11 < (int)uVar9) {
          do {
            (&pNVar3[1].Id)[uVar11] = (&pNVar3[1].iPrev)[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        if (uVar7 != 1) {
          if (uVar9 == 1) {
            ppNVar5 = p->pVerts;
            lVar12 = (long)ppNVar5[pNVar3[1].Id]->nEdges;
            if (lVar12 < 0x10) {
              iVar1 = pNVar3->Id;
              if ((long)p->pLists1[lVar12] != 0) {
                pNVar4 = ppNVar5[p->pLists1[lVar12]];
                pNVar3->iPrev = 0;
                pNVar3->iNext = pNVar4->Id;
                pNVar4->iPrev = iVar1;
              }
              p->pLists1[lVar12] = iVar1;
            }
            else {
              iVar1 = pNVar3->Id;
              if ((long)p->pLists1[0x10] != 0) {
                pNVar4 = ppNVar5[p->pLists1[0x10]];
                pNVar3->iPrev = 0;
                pNVar3->iNext = pNVar4->Id;
                pNVar4->iPrev = iVar1;
              }
              p->pLists1[0x10] = iVar1;
            }
          }
          else if (uVar9 < 0x10) {
            iVar1 = pNVar3->Id;
            if ((long)p->pLists2[uVar9] != 0) {
              pNVar4 = p->pVerts[p->pLists2[uVar9]];
              pNVar3->iPrev = 0;
              pNVar3->iNext = pNVar4->Id;
              pNVar4->iPrev = iVar1;
            }
            p->pLists2[uVar9] = iVar1;
          }
          else {
            iVar1 = pNVar3->Id;
            if ((long)p->pLists2[0x10] != 0) {
              pNVar4 = p->pVerts[p->pLists2[0x10]];
              pNVar3->iPrev = 0;
              pNVar3->iNext = pNVar4->Id;
              pNVar4->iPrev = iVar1;
            }
            p->pLists2[0x10] = iVar1;
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVertex->nEdges);
  }
  if (0 < pNext->nEdges) {
    lVar13 = 0;
    do {
      pNVar3 = p->pVerts[(&pNext[1].Id)[lVar13]];
      if (pNVar3 != pVertex) {
        Nwk_ManGraphListExtract(p,pNVar3);
        uVar7 = pNVar3->nEdges;
        if (1 < (int)uVar7) {
          lVar12 = 0;
          do {
            pNVar4 = p->pVerts[(&pNVar3[1].Id)[lVar12]];
            if ((pNVar4 != pNext) && (pNVar4->nEdges < 2)) {
              if (pNVar4->nEdges != 1) {
                __assert_fail("pOther->nEdges == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                              ,0x1f7,
                              "void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)");
              }
              Nwk_ManGraphListExtract(p,pNVar4);
              pNVar3->nEdges = pNVar3->nEdges + -1;
              uVar7 = pNVar4->nEdges;
              lVar8 = (long)(int)uVar7;
              if (lVar8 < 1) {
LAB_004e9a03:
                __assert_fail("pVertex->nEdges > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                              ,0xd5,"void Nwk_ManGraphListInsert(Nwk_Grf_t *, Nwk_Vrt_t *)");
              }
              if (uVar7 == 1) {
                ppNVar5 = p->pVerts;
                lVar8 = (long)ppNVar5[pNVar4[1].Id]->nEdges;
                if (lVar8 < 0x10) {
                  iVar1 = pNVar4->Id;
                  if ((long)p->pLists1[lVar8] != 0) {
                    pNVar6 = ppNVar5[p->pLists1[lVar8]];
                    pNVar4->iPrev = 0;
                    pNVar4->iNext = pNVar6->Id;
                    pNVar6->iPrev = iVar1;
                  }
                  p->pLists1[lVar8] = iVar1;
                }
                else {
                  iVar1 = pNVar4->Id;
                  if ((long)p->pLists1[0x10] != 0) {
                    pNVar6 = ppNVar5[p->pLists1[0x10]];
                    pNVar4->iPrev = 0;
                    pNVar4->iNext = pNVar6->Id;
                    pNVar6->iPrev = iVar1;
                  }
                  p->pLists1[0x10] = iVar1;
                }
              }
              else if (uVar7 < 0x10) {
                iVar1 = pNVar4->Id;
                if ((long)p->pLists2[lVar8] != 0) {
                  pNVar6 = p->pVerts[p->pLists2[lVar8]];
                  pNVar4->iPrev = 0;
                  pNVar4->iNext = pNVar6->Id;
                  pNVar6->iPrev = iVar1;
                }
                p->pLists2[lVar8] = iVar1;
              }
              else {
                iVar1 = pNVar4->Id;
                if ((long)p->pLists2[0x10] != 0) {
                  pNVar6 = p->pVerts[p->pLists2[0x10]];
                  pNVar4->iPrev = 0;
                  pNVar4->iNext = pNVar6->Id;
                  pNVar6->iPrev = iVar1;
                }
                p->pLists2[0x10] = iVar1;
              }
              uVar7 = pNVar3->nEdges + 1;
              pNVar3->nEdges = uVar7;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)uVar7);
        }
        if ((int)uVar7 < 1) {
LAB_004e99e4:
          __assert_fail("k < pThis->nEdges",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                        ,0x1bb,"void Nwk_ManGraphVertexRemoveEdge(Nwk_Vrt_t *, Nwk_Vrt_t *)");
        }
        uVar11 = 0;
        while ((&pNVar3[1].Id)[uVar11] != pNext->Id) {
          uVar11 = uVar11 + 1;
          if (uVar7 == uVar11) goto LAB_004e99e4;
        }
        uVar9 = uVar7 - 1;
        pNVar3->nEdges = uVar9;
        if ((int)uVar11 < (int)uVar9) {
          do {
            (&pNVar3[1].Id)[uVar11] = (&pNVar3[1].iPrev)[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        if (uVar7 != 1) {
          if (uVar9 == 1) {
            ppNVar5 = p->pVerts;
            lVar12 = (long)ppNVar5[pNVar3[1].Id]->nEdges;
            if (lVar12 < 0x10) {
              iVar1 = pNVar3->Id;
              if ((long)p->pLists1[lVar12] != 0) {
                pNVar4 = ppNVar5[p->pLists1[lVar12]];
                pNVar3->iPrev = 0;
                pNVar3->iNext = pNVar4->Id;
                pNVar4->iPrev = iVar1;
              }
              p->pLists1[lVar12] = iVar1;
            }
            else {
              iVar1 = pNVar3->Id;
              if ((long)p->pLists1[0x10] != 0) {
                pNVar4 = ppNVar5[p->pLists1[0x10]];
                pNVar3->iPrev = 0;
                pNVar3->iNext = pNVar4->Id;
                pNVar4->iPrev = iVar1;
              }
              p->pLists1[0x10] = iVar1;
            }
          }
          else if (uVar9 < 0x10) {
            iVar1 = pNVar3->Id;
            if ((long)p->pLists2[uVar9] != 0) {
              pNVar4 = p->pVerts[p->pLists2[uVar9]];
              pNVar3->iPrev = 0;
              pNVar3->iNext = pNVar4->Id;
              pNVar4->iPrev = iVar1;
            }
            p->pLists2[uVar9] = iVar1;
          }
          else {
            iVar1 = pNVar3->Id;
            if ((long)p->pLists2[0x10] != 0) {
              pNVar4 = p->pVerts[p->pLists2[0x10]];
              pNVar3->iPrev = 0;
              pNVar3->iNext = pNVar4->Id;
              pNVar4->iPrev = iVar1;
            }
            p->pLists2[0x10] = iVar1;
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pNext->nEdges);
  }
  iVar1 = pVertex->Id;
  iVar2 = pNext->Id;
  iVar10 = iVar2;
  if (iVar1 < iVar2) {
    iVar10 = iVar1;
  }
  if (iVar1 < iVar2) {
    pVertex = pNext;
  }
  Vec_IntPush(p->vPairs,p->pMapId2Lut[iVar10]);
  Vec_IntPush(p->vPairs,p->pMapId2Lut[pVertex->Id]);
  return;
}

Assistant:

void Nwk_ManGraphUpdate( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex, Nwk_Vrt_t * pNext )
{
    Nwk_Vrt_t * pChanged, * pOther;
    int i, k;
//    Nwk_ManGraphCheckLists( p );
    Nwk_ManGraphListExtract( p, pVertex );
    Nwk_ManGraphListExtract( p, pNext );
    // update neihbors of pVertex
    Nwk_VertexForEachAdjacent( p, pVertex, pChanged, i )
    {
        if ( pChanged == pNext )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pVertex || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pVertex );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // update neihbors of pNext
    Nwk_VertexForEachAdjacent( p, pNext, pChanged, i )
    {
        if ( pChanged == pVertex )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pNext || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pNext );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // add to the result
    if ( pVertex->Id < pNext->Id )
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
    }
    else
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
    }
//    Nwk_ManGraphCheckLists( p );
}